

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

int mriStep_StageSetup(ARKodeMem ark_mem)

{
  long lVar1;
  undefined8 *puVar2;
  realtype *c;
  int iVar3;
  long in_RDI;
  N_Vector *Xvecs;
  realtype *cvals;
  int nvec;
  int j;
  int i;
  int retval;
  ARKodeMRIStepMem step_mem;
  N_Vector in_stack_ffffffffffffffb8;
  N_Vector *X;
  int local_28;
  int local_24;
  int local_4;
  
  if (*(long *)(in_RDI + 0xe8) == 0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode::MRIStep","mriStep_StageSetup",
                    "Time step module memory is NULL.");
    local_4 = -0x15;
  }
  else {
    lVar1 = *(long *)(in_RDI + 0xe8);
    iVar3 = *(int *)(lVar1 + 0x88);
    puVar2 = *(undefined8 **)(lVar1 + 0x198);
    c = *(realtype **)(lVar1 + 0x1a0);
    *(double *)(lVar1 + 0xa8) =
         *(double *)(in_RDI + 0x168) *
         *(double *)
          (*(long *)(lVar1 + 0x68) + (long)*(int *)(*(long *)(lVar1 + 0x50) + (long)iVar3 * 4) * 8);
    if (*(int *)(in_RDI + 0x25c) != 0) {
      *(undefined8 *)(lVar1 + 0xb0) = *(undefined8 *)(lVar1 + 0xa8);
    }
    if (*(int *)(in_RDI + 0x25c) == 0) {
      X = (N_Vector *)(*(double *)(lVar1 + 0xa8) / *(double *)(lVar1 + 0xb0));
    }
    else {
      X = (N_Vector *)&DAT_3ff0000000000000;
    }
    *(N_Vector **)(lVar1 + 0xb8) = X;
    *puVar2 = 0x3ff0000000000000;
    *c = *(realtype *)(in_RDI + 0x108);
    puVar2[1] = 0xbff0000000000000;
    c[1] = *(realtype *)(lVar1 + 0x78);
    local_28 = 2;
    for (local_24 = 0; local_24 < iVar3; local_24 = local_24 + 1) {
      if ((*(int *)(lVar1 + 0x18) != 0) &&
         (-1 < *(int *)(*(long *)(lVar1 + 0x50) + (long)local_24 * 4))) {
        puVar2[local_28] =
             *(double *)(in_RDI + 0x168) *
             *(double *)
              (*(long *)(lVar1 + 0x60) +
              (long)*(int *)(*(long *)(lVar1 + 0x50) + (long)local_24 * 4) * 8);
        c[local_28] = *(realtype *)
                       (*(long *)(lVar1 + 0x28) +
                       (long)*(int *)(*(long *)(lVar1 + 0x50) + (long)local_24 * 4) * 8);
        local_28 = local_28 + 1;
      }
      if ((*(int *)(lVar1 + 0x1c) != 0) &&
         (-1 < *(int *)(*(long *)(lVar1 + 0x50) + (long)local_24 * 4))) {
        puVar2[local_28] =
             *(double *)(in_RDI + 0x168) *
             *(double *)
              (*(long *)(lVar1 + 0x68) +
              (long)*(int *)(*(long *)(lVar1 + 0x50) + (long)local_24 * 4) * 8);
        c[local_28] = *(realtype *)
                       (*(long *)(lVar1 + 0x30) +
                       (long)*(int *)(*(long *)(lVar1 + 0x50) + (long)local_24 * 4) * 8);
        local_28 = local_28 + 1;
      }
    }
    iVar3 = N_VLinearCombination((int)((ulong)puVar2 >> 0x20),c,X,in_stack_ffffffffffffffb8);
    if (iVar3 == 0) {
      local_4 = 0;
    }
    else {
      local_4 = -0x1c;
    }
  }
  return local_4;
}

Assistant:

int mriStep_StageSetup(ARKodeMem ark_mem)
{
  /* local data */
  ARKodeMRIStepMem step_mem;
  int retval, i, j, nvec;
  realtype* cvals;
  N_Vector* Xvecs;

  /* access ARKodeMRIStepMem structure */
  if (ark_mem->step_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode::MRIStep",
                    "mriStep_StageSetup", MSG_MRISTEP_NO_MEM);
    return(ARK_MEM_NULL);
  }
  step_mem = (ARKodeMRIStepMem) ark_mem->step_mem;

  /* Set shortcut to current stage index */
  i = step_mem->istage;

  /* local shortcuts for fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* Update gamma (if the method contains an implicit component) */
  step_mem->gamma = ark_mem->h * step_mem->Ai_row[step_mem->stage_map[i]];

  if (ark_mem->firststage)
    step_mem->gammap = step_mem->gamma;
  step_mem->gamrat = (ark_mem->firststage) ?
    ONE : step_mem->gamma / step_mem->gammap;  /* protect x/x != 1.0 */

  /* set cvals and Xvecs for setting stage data */
  cvals[0] = ONE;
  Xvecs[0] = ark_mem->ycur;
  cvals[1] = -ONE;
  Xvecs[1] = step_mem->zpred;
  nvec     = 2;

  for (j = 0; j < i; j++) {
    if (step_mem->explicit_rhs && step_mem->stage_map[j] > -1) {
      cvals[nvec] = ark_mem->h * step_mem->Ae_row[step_mem->stage_map[j]];
      Xvecs[nvec] = step_mem->Fse[step_mem->stage_map[j]];
      nvec += 1;
    }
    if (step_mem->implicit_rhs && step_mem->stage_map[j] > -1) {
      cvals[nvec] = ark_mem->h * step_mem->Ai_row[step_mem->stage_map[j]];
      Xvecs[nvec] = step_mem->Fsi[step_mem->stage_map[j]];
      nvec += 1;
    }
  }

  /* call fused vector operation to do the work */
  retval = N_VLinearCombination(nvec, cvals, Xvecs, step_mem->sdata);
  if (retval != 0) return(ARK_VECTOROP_ERR);

  /* return with success */
  return (ARK_SUCCESS);
}